

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,size_t size
              ,char **err)

{
  OffsetData *offset_data;
  uint uVar1;
  EXRHeader *exr_header;
  pointer pvVar2;
  ulong uVar3;
  long *plVar4;
  char **ppcVar5;
  EXRHeader **ppEVar6;
  int iVar7;
  int iVar8;
  OffsetData *pOVar9;
  char *pcVar10;
  long lVar11;
  pointer pOVar12;
  ulong *puVar13;
  ulong *puVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong *puVar19;
  pointer pOVar20;
  ulong uVar21;
  bool bVar22;
  byte bVar23;
  bool bVar24;
  string e;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> chunk_offset_table_list;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> num_x_tiles;
  string local_108;
  ulong local_e8;
  ulong *local_e0;
  OffsetData *local_d8;
  OffsetData *local_d0;
  char **local_c8;
  uint local_bc;
  OffsetData *local_b8;
  ulong local_b0;
  pointer local_a8;
  size_t local_a0;
  EXRHeader **local_98;
  uchar *local_90;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> local_88;
  EXRImage *local_70;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  local_90 = memory;
  local_70 = exr_images;
  if (size < 9 ||
      ((memory == (uchar *)0x0 || num_parts == 0) ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0))) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"Invalid argument for LoadEXRMultipartImageFromMemory()","");
    if (err != (char **)0x0) {
LAB_001cde42:
      pcVar10 = strdup(local_108._M_dataplus._M_p);
      *err = pcVar10;
    }
LAB_001cde4f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    iVar18 = -3;
  }
  else {
    local_b8 = (OffsetData *)(ulong)num_parts;
    pOVar9 = (OffsetData *)0x0;
    lVar16 = 0;
    do {
      local_c8 = err;
      if ((ulong)exr_headers[(long)pOVar9]->header_len == 0) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"EXRHeader variable is not initialized.","");
        err = local_c8;
        if (local_c8 != (char **)0x0) goto LAB_001cde42;
        goto LAB_001cde4f;
      }
      lVar16 = lVar16 + (ulong)exr_headers[(long)pOVar9]->header_len;
      pOVar9 = (OffsetData *)
               ((long)&(pOVar9->offsets).
                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    } while (local_b8 != pOVar9);
    local_88.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_bc = num_parts;
    local_98 = exr_headers;
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::reserve
              (&local_88,(size_type)local_b8);
    bVar22 = local_bc != 0;
    local_a0 = size;
    if (local_bc == 0) {
      iVar18 = -3;
    }
    else {
      puVar19 = (ulong *)(local_90 + lVar16 + 9);
      iVar18 = -3;
      pOVar9 = (OffsetData *)0x0;
      do {
        local_e0 = puVar19;
        local_d8 = pOVar9;
        std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::resize
                  (&local_88,
                   ((long)local_88.
                          super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_88.
                          super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
        local_a8 = local_88.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        pOVar9 = local_88.
                 super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
        exr_header = local_98[(long)local_d8];
        if ((exr_header->tiled == 0) || (exr_header->tile_level_mode == 0)) {
          tinyexr::InitSingleResolutionOffsets(pOVar9,(long)exr_header->chunk_count);
          plVar4 = *(long **)&(((pOVar9->offsets).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              )._M_impl;
          local_e8 = local_e8 & 0xffffffff00000000;
          bVar24 = plVar4[1] != *plVar4;
          puVar19 = local_e0;
          if (bVar24) {
            uVar21 = 0;
            do {
              uVar15 = *puVar19;
              if (uVar15 < size) {
                *(ulong *)(*plVar4 + uVar21 * 8) = uVar15 + 4;
                puVar19 = puVar19 + 1;
              }
              else {
                local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_108,"Invalid offset size in EXR header chunks.","");
                ppcVar5 = local_c8;
                if (local_c8 != (char **)0x0) {
                  pcVar10 = strdup(local_108._M_dataplus._M_p);
                  *ppcVar5 = pcVar10;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p);
                }
                iVar18 = -4;
              }
              size = local_a0;
              if (local_a0 <= uVar15) {
                local_e8 = CONCAT44(local_e8._4_4_,1);
                break;
              }
              uVar21 = uVar21 + 1;
              bVar24 = uVar21 < (ulong)(plVar4[1] - *plVar4 >> 3);
            } while (bVar24);
          }
          bVar24 = !bVar24;
LAB_001cdde0:
          if (bVar24) {
            local_e8 = local_e8 & 0xffffffff00000000;
          }
        }
        else {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_d0 = pOVar9;
          tinyexr::PrecalculateTileInfo(&local_48,&local_68,exr_header);
          ppEVar6 = local_98;
          pOVar9 = local_d8;
          iVar7 = tinyexr::InitTileOffsets(local_d0,local_98[(long)local_d8],&local_48,&local_68);
          iVar8 = ppEVar6[(long)pOVar9]->chunk_count;
          pOVar9 = local_d0;
          if (iVar7 != iVar8) {
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_108,"Invalid offset table size.","");
            ppcVar5 = local_c8;
            if (local_c8 != (char **)0x0) {
              pcVar10 = strdup(local_108._M_dataplus._M_p);
              *ppcVar5 = pcVar10;
            }
            pOVar9 = local_d0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p);
            }
            iVar18 = -4;
          }
          if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          puVar19 = local_e0;
          if (iVar7 == iVar8) {
            if (local_a8[-1].offsets.
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_a8[-1].offsets.
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar21 = 0;
              do {
                pvVar2 = (pOVar9->offsets).
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar8 = 0xe;
                uVar15 = uVar21;
                if (*(pointer *)
                     ((long)&pvVar2[uVar21].
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl + 8) !=
                    *(pointer *)
                     &pvVar2[uVar21].
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl) {
                  puVar14 = (ulong *)0x0;
                  local_b0 = uVar21;
                  do {
                    lVar16 = *(long *)&(pOVar9->offsets).
                                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl;
                    iVar8 = 0x11;
                    bVar23 = *(long *)(lVar16 + 8 + (long)puVar14 * 0x18) !=
                             *(long *)(lVar16 + (long)puVar14 * 0x18);
                    if ((bool)bVar23) {
                      uVar15 = 0;
                      uVar17 = 1;
                      local_e0 = puVar14;
                      do {
                        uVar3 = *puVar19;
                        if (uVar3 < size) {
                          *(ulong *)(*(long *)(*(long *)&(pOVar9->offsets).
                                                                                                                  
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl + (long)puVar14 * 0x18) + uVar15 * 8) =
                               uVar3 + 4;
                          puVar19 = puVar19 + 1;
                        }
                        else {
                          local_e8 = CONCAT71(local_e8._1_7_,bVar23);
                          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_108,
                                     "Invalid offset size in EXR header chunks.","");
                          ppcVar5 = local_c8;
                          if (local_c8 != (char **)0x0) {
                            pcVar10 = strdup(local_108._M_dataplus._M_p);
                            *ppcVar5 = pcVar10;
                          }
                          size = local_a0;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_108._M_dataplus._M_p != &local_108.field_2) {
                            operator_delete(local_108._M_dataplus._M_p);
                          }
                          iVar18 = -4;
                          bVar23 = (byte)local_e8;
                          pOVar9 = local_d0;
                        }
                        if (size <= uVar3) {
                          iVar8 = 1;
                          puVar14 = local_e0;
                          goto LAB_001cdc61;
                        }
                        lVar16 = *(long *)&(pOVar9->offsets).
                                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                           ._M_impl;
                        uVar15 = *(long *)(lVar16 + 8 + (long)puVar14 * 0x18) -
                                 *(long *)(lVar16 + (long)puVar14 * 0x18) >> 3;
                        bVar23 = uVar17 < uVar15;
                        bVar24 = uVar17 < uVar15;
                        uVar15 = uVar17;
                        uVar17 = (ulong)((int)uVar17 + 1);
                      } while (bVar24);
                      iVar8 = 0x11;
                      puVar14 = local_e0;
                    }
LAB_001cdc61:
                    uVar15 = local_b0;
                    if ((bVar23 & 1) != 0) goto LAB_001cdca2;
                    pvVar2 = (pOVar9->offsets).
                             super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    puVar14 = (ulong *)(ulong)((int)puVar14 + 1);
                    puVar13 = (ulong *)(((long)*(pointer *)
                                                ((long)&pvVar2[uVar21].
                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl + 8) -
                                         *(long *)&pvVar2[uVar21].
                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl >> 3) * -0x5555555555555555);
                  } while (puVar14 <= puVar13 && (long)puVar13 - (long)puVar14 != 0);
                  iVar8 = 0xe;
                }
LAB_001cdca2:
                if (iVar8 != 0xe) goto LAB_001cddd9;
                uVar21 = (ulong)((int)uVar15 + 1);
                uVar15 = ((long)local_a8[-1].offsets.
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_a8[-1].offsets.
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555;
              } while (uVar21 <= uVar15 && uVar15 - uVar21 != 0);
            }
            iVar8 = 0xb;
LAB_001cddd9:
            local_e8 = CONCAT44(local_e8._4_4_,iVar8);
            bVar24 = iVar8 == 0xb;
            goto LAB_001cdde0;
          }
          local_e8 = CONCAT44(local_e8._4_4_,1);
        }
        if ((int)local_e8 != 0) break;
        pOVar9 = (OffsetData *)
                 ((long)&(local_d8->offsets).
                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
        bVar22 = pOVar9 < local_b8;
      } while (pOVar9 != local_b8);
    }
    if (!bVar22) {
      if (local_bc != 0) {
        pOVar9 = (OffsetData *)0x0;
        do {
          offset_data = local_88.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)pOVar9;
          bVar23 = local_88.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pOVar9].offsets.
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                   local_88.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)pOVar9].offsets.
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_d0 = pOVar9;
          if ((bool)bVar23) {
            pOVar20 = (pointer)0x0;
            do {
              local_b0 = CONCAT71(local_b0._1_7_,bVar23);
              pvVar2 = (offset_data->offsets).
                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              bVar23 = *(pointer *)
                        ((long)&pvVar2[(long)pOVar20].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl + 8) !=
                       *(pointer *)
                        &pvVar2[(long)pOVar20].
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl;
              local_a8 = pOVar20;
              if ((bool)bVar23) {
                puVar19 = (ulong *)0x0;
                do {
                  local_d8 = (OffsetData *)CONCAT71(local_d8._1_7_,bVar23);
                  lVar16 = *(long *)&(offset_data->offsets).
                                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[(long)pOVar20].
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl;
                  uVar21 = (long)puVar19 * 3;
                  lVar11 = *(long *)(lVar16 + (long)puVar19 * 0x18);
                  bVar22 = *(long *)(lVar16 + 8 + (long)puVar19 * 0x18) != lVar11;
                  local_e0 = puVar19;
                  if (bVar22) {
                    uVar15 = 0;
                    uVar17 = 1;
                    local_e8 = uVar21;
                    do {
                      uVar1 = *(uint *)(local_90 + *(long *)(lVar11 + uVar15 * 8) + -4);
                      if (pOVar9 != (OffsetData *)(ulong)uVar1) {
                        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_108,
                                   "Invalid `part number\' in EXR header chunks.","");
                        ppcVar5 = local_c8;
                        if (local_c8 != (char **)0x0) {
                          pcVar10 = strdup(local_108._M_dataplus._M_p);
                          *ppcVar5 = pcVar10;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_108._M_dataplus._M_p != &local_108.field_2) {
                          operator_delete(local_108._M_dataplus._M_p);
                        }
                        iVar18 = -4;
                        pOVar9 = local_d0;
                        uVar21 = local_e8;
                      }
                      if (pOVar9 != (OffsetData *)(ulong)uVar1) break;
                      lVar16 = *(long *)&(offset_data->offsets).
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[(long)pOVar20].
                                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                         ._M_impl;
                      lVar11 = *(long *)(lVar16 + uVar21 * 8);
                      uVar15 = *(long *)(lVar16 + 8 + uVar21 * 8) - lVar11 >> 3;
                      bVar22 = uVar17 < uVar15;
                      bVar24 = uVar17 < uVar15;
                      uVar15 = uVar17;
                      uVar17 = (ulong)((int)uVar17 + 1);
                    } while (bVar24);
                  }
                  if (bVar22) {
                    bVar23 = (byte)local_d8;
                    break;
                  }
                  puVar19 = (ulong *)(ulong)((int)local_e0 + 1);
                  pvVar2 = (offset_data->offsets).
                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  puVar14 = (ulong *)(((long)*(pointer *)
                                              ((long)&pvVar2[(long)pOVar20].
                                                                                                            
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl + 8) -
                                       *(long *)&pvVar2[(long)pOVar20].
                                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                 ._M_impl >> 3) * -0x5555555555555555);
                  bVar22 = (long)puVar14 - (long)puVar19 != 0;
                  bVar23 = puVar19 <= puVar14 && bVar22;
                } while (puVar19 <= puVar14 && bVar22);
              }
              size = local_a0;
              if ((bVar23 & 1) != 0) {
                bVar23 = (byte)local_b0;
                break;
              }
              pOVar20 = (pointer)(ulong)((int)local_a8 + 1);
              pOVar12 = (pointer)(((long)(offset_data->offsets).
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(offset_data->offsets).
                                         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555);
              bVar22 = (long)pOVar12 - (long)pOVar20 != 0;
              bVar23 = pOVar20 <= pOVar12 && bVar22;
            } while (pOVar20 <= pOVar12 && bVar22);
          }
          if ((bVar23 & 1) == 0) {
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            local_108._M_string_length = 0;
            local_108.field_2._M_local_buf[0] = '\0';
            iVar8 = tinyexr::DecodeChunk
                              (local_70 + (long)pOVar9,local_98[(long)pOVar9],offset_data,local_90,
                               size,&local_108);
            bVar22 = iVar8 == 0;
            if (((!bVar22) && (iVar18 = iVar8, local_c8 != (char **)0x0)) &&
               (local_108._M_string_length != 0)) {
              pcVar10 = strdup(local_108._M_dataplus._M_p);
              *local_c8 = pcVar10;
            }
            pOVar9 = local_d0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p);
              pOVar9 = local_d0;
            }
          }
          else {
            bVar22 = false;
          }
          if (!bVar22) goto LAB_001ce0f6;
          pOVar9 = (OffsetData *)
                   ((long)&(pOVar9->offsets).
                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
        } while (pOVar9 != local_b8);
      }
      iVar18 = 0;
    }
LAB_001ce0f6:
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector(&local_88);
  }
  return iVar18;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const size_t size, const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL || (size <= tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage(
        "Invalid argument for LoadEXRMultipartImageFromMemory()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<tinyexr::OffsetData> chunk_offset_table_list;
  chunk_offset_table_list.reserve(num_parts);
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    chunk_offset_table_list.resize(chunk_offset_table_list.size() + 1);
    tinyexr::OffsetData& offset_data = chunk_offset_table_list.back();
    if (!exr_headers[i]->tiled || exr_headers[i]->tile_level_mode == TINYEXR_TILE_ONE_LEVEL) {
      tinyexr::InitSingleResolutionOffsets(offset_data, size_t(exr_headers[i]->chunk_count));
      std::vector<tinyexr::tinyexr_uint64>& offset_table = offset_data.offsets[0][0];

      for (size_t c = 0; c < offset_table.size(); c++) {
        tinyexr::tinyexr_uint64 offset;
        memcpy(&offset, marker, 8);
        tinyexr::swap8(&offset);

        if (offset >= size) {
          tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                                   err);
          return TINYEXR_ERROR_INVALID_DATA;
        }

        offset_table[c] = offset + 4;  // +4 to skip 'part number'
        marker += 8;
      }
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        tinyexr::PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i]);
        int num_blocks = InitTileOffsets(offset_data, exr_headers[i], num_x_tiles, num_y_tiles);
        if (num_blocks != exr_headers[i]->chunk_count) {
          tinyexr::SetErrorMessage("Invalid offset table size.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
      for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
        for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
          for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
            tinyexr::tinyexr_uint64 offset;
            memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
            tinyexr::swap8(&offset);
            if (offset >= size) {
              tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                err);
              return TINYEXR_ERROR_INVALID_DATA;
            }
            offset_data.offsets[l][dy][dx] = offset + 4; // +4 to skip 'part number'
            marker += sizeof(tinyexr::tinyexr_uint64);  // = 8 
          }
        }
      }
    }
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    tinyexr::OffsetData &offset_data = chunk_offset_table_list[i];

    // First check 'part number' is identitical to 'i'
    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
        for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {

          const unsigned char *part_number_addr =
              memory + offset_data.offsets[l][dy][dx] - 4;  // -4 to move to 'part number' field.
          unsigned int part_no;
          memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
          tinyexr::swap4(&part_no);

          if (part_no != i) {
            tinyexr::SetErrorMessage("Invalid `part number' in EXR header chunks.",
                                     err);
            return TINYEXR_ERROR_INVALID_DATA;
          }
        }

    std::string e;
    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_data,
                                   memory, size, &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}